

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

tc_toktyp_t __thiscall CTcTokenizer::next_on_line_xlat_keep(CTcTokenizer *this)

{
  utf8_ptr *p;
  tok_embed_ctx *ec;
  wchar_t wVar1;
  tc_toktyp_t tVar2;
  char *pcVar3;
  CVmHashEntry *pCVar4;
  
  p = &this->p_;
  ec = &this->main_in_embedding_;
  do {
    skip_ws_and_markers(p);
    wVar1 = utf8_ptr::getch(p);
    if (wVar1 == L'>') {
      if (((ec->level != 0) && (((this->main_in_embedding_).s)->parens == 0)) &&
         (wVar1 = utf8_ptr::getch_at(p,1), wVar1 == L'>')) goto LAB_002177b0;
    }
    else if (wVar1 == L'R') {
      wVar1 = utf8_ptr::getch_at(p,1);
      if ((wVar1 == L'\"') || (wVar1 = utf8_ptr::getch_at(p,1), wVar1 == L'\'')) goto LAB_002177b0;
    }
    else if ((wVar1 == L'\'') || (wVar1 == L'\"')) {
LAB_002177b0:
      tVar2 = xlat_string_to_src(this,ec,0);
      return tVar2;
    }
    tVar2 = next_on_line(p,&this->curtok_,ec,0);
    if (tVar2 != TOKT_INVALID) {
      if (tVar2 - TOKT_FLOAT < 2) {
        pcVar3 = store_source(this,(this->curtok_).text_,(this->curtok_).text_len_);
        (this->curtok_).text_ = pcVar3;
      }
      else if (tVar2 == TOKT_SYM) {
        pCVar4 = CVmHashTable::find(this->kw_,(this->curtok_).text_,(this->curtok_).text_len_);
        if (pCVar4 == (CVmHashEntry *)0x0) {
          pcVar3 = store_source(this,(this->curtok_).text_,(this->curtok_).text_len_);
          (this->curtok_).text_ = pcVar3;
          tVar2 = TOKT_SYM;
        }
        else {
          tVar2 = *(tc_toktyp_t *)&pCVar4->field_0x24;
          (this->curtok_).typ_ = tVar2;
        }
      }
      return tVar2;
    }
    wVar1 = utf8_ptr::s_getch((this->curtok_).text_);
    log_error_curtok(this,(uint)(wVar1 == L'�') * 9 + 0x2745);
    utf8_ptr::inc(p);
  } while( true );
}

Assistant:

tc_toktyp_t CTcTokenizer::next_on_line_xlat_keep()
{
    tc_toktyp_t typ;

    /* keep going until we find a valid symbol */
    for (;;)
    {
        /* skip whitespace and macro expansion flags */
        skip_ws_and_markers(&p_);
        
        /* see what we have */
        switch(p_.getch())
        {
        case '"':
        case '\'':
            /* it's a string - translate and save it */
            return xlat_string_to_src(&main_in_embedding_, FALSE);

        case '>':
            /* if we're in an embedding, this is the end of it */
            if (main_in_embedding_.in_expr()
                && main_in_embedding_.parens() == 0
                && p_.getch_at(1) == '>')
                return xlat_string_to_src(&main_in_embedding_, FALSE);

            /* use the normal parsing */
            goto do_normal;

        case 'R':
            /* check for a regex string */
            if (p_.getch_at(1) == '"' || p_.getch_at(1) == '\'')
                return xlat_string_to_src(&main_in_embedding_, FALSE);

            /* not a regex string - fall through to the default case */
            
        default:
        do_normal:
            /* for anything else, use the default tokenizer */
            typ = next_on_line(&p_, &curtok_, &main_in_embedding_, FALSE);
            
            /* check the token type */
            switch(typ)
            {
            case TOKT_SYM:
                /* symbol */
                {
                    const char *p;
                    CTcHashEntryKw *kw;
                
                    /* look it up in the keyword table */
                    kw = (CTcHashEntryKw *)kw_->find(curtok_.get_text(),
                        curtok_.get_text_len());
                    if (kw != 0)
                    {
                        /* replace the token with the keyword token type */
                        typ = kw->get_tok_id();
                        curtok_.settyp(typ);
                    }
                    else
                    {
                        /* ordinary symbol - save the text */
                        p = store_source(curtok_.get_text(),
                                         curtok_.get_text_len());
                        
                        /* 
                         *   change the token's text to point to the
                         *   source block, so that this token's text
                         *   pointer will remain permanently valid (the
                         *   original copy, in the source line buffer,
                         *   will be overwritten as soon as we read
                         *   another source line; we don't want the caller
                         *   to have to worry about this, so we return the
                         *   permanent copy) 
                         */
                        curtok_.set_text(p, curtok_.get_text_len());
                    }
                }
                break;

            case TOKT_FLOAT:
            case TOKT_BIGINT:
                /* floating-point number (or promoted large integer) */
                {
                    const char *p;

                    /* 
                     *   save the text so that it remains permanently
                     *   valid - we keep track of floats by the original
                     *   text, and let the code generator produce the
                     *   appropriate object file representation 
                     */
                    p = store_source(curtok_.get_text(),
                                     curtok_.get_text_len());
                    curtok_.set_text(p, curtok_.get_text_len());
                }
                break;

            case TOKT_INVALID:
                /* 
                 *   check for unmappable characters - these will show up as
                 *   Unicode U+FFFD, the "replacement character"; log it as
                 *   'unmappable' if applicable, otherwise as an invalid
                 *   character 
                 */
                if (utf8_ptr::s_getch(curtok_.get_text()) == 0xfffd)
                    log_error_curtok(TCERR_UNMAPPABLE_CHAR);
                else
                    log_error_curtok(TCERR_INVALID_CHAR);

                /* skip this character */
                p_.inc();
                
                /* keep going */
                continue;

            default:
                break;
            }
        }

        /* return the type */
        return typ;
    }
}